

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O2

bool helics::BrokerFactory::copyBrokerIdentifier(string_view copyFromName,string_view copyToName)

{
  bool bVar1;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  string local_48;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_48,&local_18,&local_69);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_68,&local_28,&local_6a);
  bVar1 = gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::copyObject
                    ((SearchableObjectHolder<helics::Broker,_helics::CoreType> *)searchableBrokers,
                     &local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return bVar1;
}

Assistant:

bool copyBrokerIdentifier(std::string_view copyFromName, std::string_view copyToName)
{
    return searchableBrokers.copyObject(std::string(copyFromName), std::string(copyToName));
}